

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

Gia_Man_t * Gia_ManBuildGig2(Vec_Int_t *vObjs,Vec_Int_t *vStore,char *pFileName)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  undefined4 *__s;
  Gia_Man_t *p_01;
  size_t sVar5;
  char *pcVar6;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  iVar3 = vObjs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  p->nSize = 0;
  p->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 * 4);
  }
  p->pArray = piVar4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  p_00->pArray = piVar4;
  iVar3 = vObjs->nSize;
  if (0 < iVar3) {
    lVar12 = 0;
    do {
      iVar3 = vObjs->pArray[lVar12];
      if (((((long)iVar3 < 0) || (vStore->nSize <= iVar3)) ||
          (Vec_IntPush(p,vStore->pArray[iVar3]), vObjs->nSize <= lVar12)) ||
         ((vObjs->pArray[lVar12] < -1 ||
          (uVar2 = vObjs->pArray[lVar12] + 1, vStore->nSize <= (int)uVar2)))) goto LAB_006af594;
      Vec_IntPush(p_00,vStore->pArray[uVar2]);
      lVar12 = lVar12 + 1;
      iVar3 = vObjs->nSize;
    } while (lVar12 < iVar3);
  }
  uVar2 = p->nSize;
  if ((ulong)uVar2 == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *p->pArray;
    if (1 < (int)uVar2) {
      uVar8 = 1;
      do {
        uVar1 = p->pArray[uVar8];
        if ((int)uVar11 <= (int)uVar1) {
          uVar11 = uVar1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  iVar9 = 0x10;
  if (0xe < uVar11) {
    iVar9 = uVar11 + 1;
  }
  if (iVar9 == 0) {
    __s = (undefined4 *)0x0;
  }
  else {
    __s = (undefined4 *)malloc((long)iVar9 << 2);
  }
  memset(__s,0xff,(long)(int)(uVar11 + 1) << 2);
  if (((int)uVar11 < 0) || (*__s = 0, uVar11 == 0)) {
LAB_006af5b3:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __s[1] = 1;
  p_01 = Gia_ManStart(iVar3);
  if (pFileName == (char *)0x0) {
    p_01->pName = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pFileName);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pFileName);
    p_01->pName = pcVar6;
    sVar5 = strlen(pFileName);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pFileName);
  }
  p_01->pSpec = pcVar6;
  if (0 < vObjs->nSize) {
    uVar10 = 0;
    uVar8 = (ulong)(uint)p_00->nSize;
    if (p_00->nSize < 1) {
      uVar8 = uVar10;
    }
    do {
      if (uVar8 == uVar10) goto LAB_006af594;
      if (p_00->pArray[uVar10] == 2) {
        if ((long)(int)uVar2 <= (long)uVar10) goto LAB_006af594;
        uVar1 = p->pArray[uVar10];
        iVar3 = Gia_ManAppendCi(p_01);
        if (uVar11 < uVar1) goto LAB_006af5b3;
        __s[uVar1] = iVar3;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)vObjs->nSize);
  }
  if (0 < vObjs->nSize) {
    uVar10 = 0;
    uVar8 = (ulong)(uint)p_00->nSize;
    if (p_00->nSize < 1) {
      uVar8 = uVar10;
    }
    do {
      if (uVar8 == uVar10) goto LAB_006af594;
      if (p_00->pArray[uVar10] == 7) {
        if ((long)(int)uVar2 <= (long)uVar10) goto LAB_006af594;
        uVar1 = p->pArray[uVar10];
        iVar3 = Gia_ManAppendCi(p_01);
        if (uVar11 < uVar1) goto LAB_006af5b3;
        __s[uVar1] = iVar3;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)vObjs->nSize);
  }
  Gia_ManHashAlloc(p_01);
  if (0 < vObjs->nSize) {
    uVar2 = 0;
    if (0 < p_00->nSize) {
      uVar2 = p_00->nSize;
    }
    if (uVar2 <= vObjs->nSize - 1U) {
LAB_006af594:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  free(__s);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pGVar7 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManBuildGig2( Vec_Int_t * vObjs, Vec_Int_t * vStore, char * pFileName )
{
    Gia_Man_t * pNew, * pTemp;
    //int * nObjs = Gia_ManGigCount( vObjs, vStore );
    Vec_Int_t * vNets = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vTypes = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Vec_Int_t * vMap;
    int i, Type;
    // connect net IDs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Vec_IntPush( vNets, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i)) );
        Vec_IntPush( vTypes, Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1) );
    }
    // create mapping for net IDs into GIA IDs
    vMap = Vec_IntStartFull( Vec_IntFindMax(vNets) + 1 ); 
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create new manager
    pNew = Gia_ManStart( Vec_IntSize(vObjs) );
    pNew->pName = Abc_UtilStrsav( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    // create primary inputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_PI )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create box outputs
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        if ( Vec_IntEntry(vTypes, i) == GIG_BOX )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vNets, i), Gia_ManAppendCi(pNew) );
    // create internal nodes
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        Type = Vec_IntEntry(vTypes, i);
        if ( Type != GIG_LUT && Type != GIG_DELAY && Type != GIG_BAR )
            continue;

    }
    Vec_IntFree( vMap );
    Vec_IntFree( vNets );
    Vec_IntFree( vTypes );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}